

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

BrOn * __thiscall MixedArena::alloc<wasm::BrOn>(MixedArena *this)

{
  BrOn *pBVar1;
  
  pBVar1 = (BrOn *)allocSpace(this,0x38,8);
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression._id = BrOnId;
  (pBVar1->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.type.id = 0;
  (pBVar1->name).super_IString.str._M_len = 0;
  (pBVar1->name).super_IString.str._M_str = (char *)0x0;
  (pBVar1->castType).id = 0;
  return pBVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }